

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O0

void h262_print_macroblock(h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,int addr)

{
  int iVar1;
  uint in_ECX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int j;
  int t;
  int s;
  int r;
  int dmv;
  int mfs;
  int mvc;
  int i;
  int local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint local_20;
  
  printf("\tMacroblock %d: (%d, %d)\n",(ulong)in_ECX,(ulong)(in_ECX % *(uint *)(in_RSI + 0x4a0)),
         (ulong)in_ECX / (ulong)*(uint *)(in_RSI + 0x4a0));
  printf("\t\tmacroblock_flags =");
  if (*in_RDX != 0) {
    printf(" SKIP");
  }
  if (in_RDX[1] != 0) {
    printf(" QUANT");
  }
  if (in_RDX[2] != 0) {
    printf(" FWD");
  }
  if (in_RDX[3] != 0) {
    printf(" BWD");
  }
  if (in_RDX[4] != 0) {
    printf(" PATTERN");
  }
  if (in_RDX[5] != 0) {
    printf(" INTRA");
  }
  printf("\n");
  if (in_RDX[5] == 0) {
    if (*(int *)(in_RSI + 0x34) == 3) {
      printf("\t\tframe_motion_type = %d [%s]\n",(ulong)(uint)in_RDX[6],
             h262_print_macroblock::frpms[(uint)in_RDX[6]]);
    }
    else {
      printf("\t\tfield_motion_type = %d [%s]\n",(ulong)(uint)in_RDX[7],
             h262_print_macroblock::fipms[(uint)in_RDX[7]]);
    }
  }
  if ((in_RDX[5] != 0) || (in_RDX[4] != 0)) {
    printf("\t\tdct_type = %d\n",(ulong)(uint)in_RDX[8]);
  }
  printf("\t\tquantiser_scale_code = %d\n",(ulong)(uint)in_RDX[9]);
  if ((in_RDX[5] == 0) && (*in_RDX == 0)) {
    if (*(int *)(in_RSI + 0x34) == 3) {
      iVar1 = in_RDX[6];
      if (iVar1 == 1) {
        local_24 = 2;
        local_28 = 1;
        local_2c = 0;
      }
      else if (iVar1 == 2) {
        local_24 = 1;
        local_28 = 0;
        local_2c = 0;
      }
      else if (iVar1 == 3) {
        local_24 = 1;
        local_28 = 0;
        local_2c = 1;
      }
      else {
        local_24 = 0;
      }
    }
    else {
      iVar1 = in_RDX[7];
      if (iVar1 == 1) {
        local_24 = 1;
        local_28 = 1;
        local_2c = 0;
      }
      else if (iVar1 == 2) {
        local_24 = 2;
        local_28 = 1;
        local_2c = 0;
      }
      else if (iVar1 == 3) {
        local_24 = 1;
        local_28 = 0;
        local_2c = 1;
      }
      else {
        local_24 = 0;
      }
    }
    for (local_30 = 0; (int)local_30 < local_24; local_30 = local_30 + 1) {
      for (local_34 = 0; (int)local_34 < 2; local_34 = local_34 + 1) {
        if (((local_34 != 0) || (in_RDX[2] != 0)) && ((local_34 != 1 || (in_RDX[3] != 0)))) {
          if (local_28 != 0) {
            printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n",(ulong)local_30,(ulong)local_34
                   ,(ulong)(uint)in_RDX[(long)(int)local_30 * 2 + (long)(int)local_34 + 10]);
          }
          for (local_38 = 0; (int)local_38 < 2; local_38 = local_38 + 1) {
            printf("\t\tmotion_code[%d][%d][%d] = %d\n",(ulong)local_30,(ulong)local_34,
                   (ulong)local_38,
                   (ulong)(uint)in_RDX[(long)(int)local_30 * 4 +
                                       (long)(int)local_34 * 2 + (long)(int)local_38 + 0xe]);
            printf("\t\tmotion_residual[%d][%d][%d] = %d\n",(ulong)local_30,(ulong)local_34,
                   (ulong)local_38,
                   (ulong)(uint)in_RDX[(long)(int)local_30 * 4 +
                                       (long)(int)local_34 * 2 + (long)(int)local_38 + 0x16]);
            if (local_2c != 0) {
              printf("\t\tdmvector[%d] = %d\n",(ulong)local_38,
                     (ulong)(uint)in_RDX[(long)(int)local_38 + 0x1e]);
            }
          }
        }
      }
    }
  }
  printf("\t\tcoded_block_pattern = 0x%x\n",(ulong)(uint)in_RDX[0x20]);
  for (local_20 = 0; (int)local_20 < h262_print_macroblock::block_count[*(uint *)(in_RDI + 0x230)];
      local_20 = local_20 + 1) {
    printf("\t\tBlock %d:",(ulong)local_20);
    for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 1) {
      printf(" %d",(ulong)(uint)in_RDX[(long)(int)local_20 * 0x40 + (long)local_3c + 0x21]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void h262_print_macroblock(struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int addr) {
	int i;
	static const int block_count[4] = { 4, 6, 8, 12 };
	static const char *const frpms[] = { "???", "field", "frame", "dual-prime" };
	static const char *const fipms[] = { "???", "field", "16x8", "dual-prime" };
	printf("\tMacroblock %d: (%d, %d)\n", addr, addr % picparm->pic_width_in_mbs, addr / picparm->pic_width_in_mbs);
	printf("\t\tmacroblock_flags =");
	if (mb->macroblock_skipped)
		printf(" SKIP");
	if (mb->macroblock_quant)
		printf(" QUANT");
	if (mb->macroblock_motion_forward)
		printf(" FWD");
	if (mb->macroblock_motion_backward)
		printf(" BWD");
	if (mb->macroblock_pattern)
		printf(" PATTERN");
	if (mb->macroblock_intra)
		printf(" INTRA");
	printf("\n");
	if (!mb->macroblock_intra) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			printf("\t\tframe_motion_type = %d [%s]\n", mb->frame_motion_type, frpms[mb->frame_motion_type]);
		} else {
			printf("\t\tfield_motion_type = %d [%s]\n", mb->field_motion_type, fipms[mb->field_motion_type]);
		}
	}
	if (mb->macroblock_intra || mb->macroblock_pattern)
		printf("\t\tdct_type = %d\n", mb->dct_type);
	printf("\t\tquantiser_scale_code = %d\n", mb->quantiser_scale_code);
	if (!mb->macroblock_intra && !mb->macroblock_skipped) {
		int mvc, mfs, dmv;
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			switch (mb->frame_motion_type) {
				case H262_FRAME_MOTION_FIELD:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_FRAME:
					mvc = 1;
					mfs = 0;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		} else {
			switch (mb->field_motion_type) {
				case H262_FIELD_MOTION_FIELD:
					mvc = 1;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_16X8:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		}
		int r, s, t;
		for (r = 0; r < mvc; r++) {
			for (s = 0; s < 2; s++) {
				if (s == 0 && !mb->macroblock_motion_forward)
					continue;
				if (s == 1 && !mb->macroblock_motion_backward)
					continue;
				if (mfs)
					printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n", r, s, mb->motion_vertical_field_select[r][s]);
				for (t = 0; t < 2; t++) {
					printf("\t\tmotion_code[%d][%d][%d] = %d\n", r, s, t, mb->motion_code[r][s][t]);
					printf("\t\tmotion_residual[%d][%d][%d] = %d\n", r, s, t, mb->motion_residual[r][s][t]);
					if (dmv)
						printf("\t\tdmvector[%d] = %d\n", t, mb->dmvector[t]);
				}
			}
		}
	}
	printf("\t\tcoded_block_pattern = 0x%x\n", mb->coded_block_pattern);
	for (i = 0; i < block_count[seqparm->chroma_format]; i++) {
		printf("\t\tBlock %d:", i);
		int j;
		for (j = 0; j < 64; j++)
			printf(" %d", mb->block[i][j]);
		printf("\n");
	}
}